

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseIncoming.cpp
# Opt level: O3

Result __thiscall tonk::SessionIncoming::resumeProcessing(SessionIncoming *this)

{
  ostringstream *this_00;
  ushort uVar1;
  uint8_t *data;
  undefined8 *puVar2;
  int iVar3;
  uint uVar4;
  uchar *puVar5;
  SiameseResult SVar6;
  OutputWorker *this_01;
  RefCounter *pRVar7;
  Result *success;
  long in_RSI;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  SiameseOriginalPacket packet;
  SiameseOriginalPacket local_1f0;
  MessageDecompressor *local_1e0;
  string local_1d8;
  undefined1 local_1b8 [392];
  
  local_1e0 = (MessageDecompressor *)(in_RSI + 0x4b8);
  do {
    local_1f0.PacketNum = *(uint *)(in_RSI + 0x270);
    SVar6 = siamese_decoder_get(*(SiameseDecoder *)(in_RSI + 0x268),&local_1f0);
    puVar5 = local_1f0.Data;
    uVar4 = local_1f0.DataBytes;
    if (SVar6 != Siamese_Success) {
      if (SVar6 == Siamese_NeedMoreData) {
        (this->Deps).ConnectionRef = (RefCounter *)0x0;
      }
      else {
        local_1b8._0_8_ = local_1b8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1b8,"siamese_decoder_get failed","");
        pRVar7 = (RefCounter *)operator_new(0x38);
        *(char **)pRVar7 = "SessionIncoming::resumeProcessing";
        (pRVar7->ShutdownJson)._M_dataplus._M_p = (pointer)&(pRVar7->ShutdownJson).field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&pRVar7->ShutdownJson,local_1b8._0_8_,
                   (char *)(local_1b8._0_8_ + CONCAT44(local_1b8._12_4_,local_1b8._8_4_)));
        (pRVar7->RefCount).super___atomic_base<int>._M_i = 1;
        (this->Deps).ConnectionRef = pRVar7;
        *(long *)&(pRVar7->ShutdownLock).super___mutex_base._M_mutex = (long)(int)SVar6;
        if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
          operator_delete((void *)local_1b8._0_8_);
        }
        puVar2 = *(undefined8 **)(in_RSI + 0x28);
        Result::ToJson_abi_cxx11_(&local_1d8,(Result *)this);
        if (*(int *)(puVar2 + 1) < 5) {
          local_1b8._0_8_ = *puVar2;
          this_00 = (ostringstream *)(local_1b8 + 0x10);
          local_1b8._8_4_ = Error;
          std::__cxx11::ostringstream::ostringstream(this_00);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)this_00,(char *)puVar2[7],puVar2[8]);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)this_00,"siamese_decoder_get failed: ",0x1c);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)this_00,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
          this_01 = logger::OutputWorker::GetInstance();
          logger::OutputWorker::Write(this_01,(LogStringBuffer *)local_1b8);
          std::__cxx11::ostringstream::~ostringstream(this_00);
          std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
LAB_001299b1:
          operator_delete(local_1d8._M_dataplus._M_p);
        }
      }
      return (Result)(ErrorResult *)this;
    }
    *(undefined8 *)(in_RSI + 0x6290) = 0;
    uVar9 = 0;
    *(uint *)(in_RSI + 0x270) = *(int *)(in_RSI + 0x270) + 1U & 0x3fffff;
    iVar3 = (int)local_1f0.Data;
    if (1 < local_1f0.DataBytes) {
      uVar10 = 0;
      do {
        uVar1 = *(ushort *)(puVar5 + uVar10);
        iVar8 = (int)uVar10 + 2;
        if (uVar4 - iVar8 < (uVar1 & 0x7ff)) {
          local_1b8._0_8_ = local_1b8 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1b8,"Truncated message","");
          pRVar7 = (RefCounter *)operator_new(0x38);
          *(char **)pRVar7 = "SessionIncoming::resumeProcessing";
          (pRVar7->ShutdownJson)._M_dataplus._M_p = (pointer)&(pRVar7->ShutdownJson).field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&pRVar7->ShutdownJson,local_1b8._0_8_,
                     (char *)(local_1b8._0_8_ + CONCAT44(local_1b8._12_4_,local_1b8._8_4_)));
          goto LAB_00129994;
        }
        if (uVar1 >> 0xb != 0x1f && 0x27ff < uVar1) {
          handleReliableMessage
                    (this,(uint)in_RSI,(uint8_t *)(ulong)(uint)(uVar1 >> 0xb),iVar8 + iVar3);
          if ((this->Deps).ConnectionRef != (RefCounter *)0x0) {
            return (Result)(ErrorResult *)this;
          }
          Result::~Result((Result *)this);
        }
        uVar9 = iVar8 + (uVar1 & 0x7ff);
        uVar10 = (ulong)uVar9;
      } while (1 < uVar4 - uVar9);
    }
    if (uVar4 != uVar9) {
      local_1b8._0_8_ = local_1b8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"Invalid frame","");
      pRVar7 = (RefCounter *)operator_new(0x38);
      *(char **)pRVar7 = "SessionIncoming::resumeProcessing";
      (pRVar7->ShutdownJson)._M_dataplus._M_p = (pointer)&(pRVar7->ShutdownJson).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&pRVar7->ShutdownJson,local_1b8._0_8_,
                 (char *)(local_1b8._0_8_ + CONCAT44(local_1b8._12_4_,local_1b8._8_4_)));
LAB_00129994:
      (pRVar7->RefCount).super___atomic_base<int>._M_i = 0;
      (pRVar7->ShutdownLock).super___mutex_base._M_mutex.__align = 9;
      (this->Deps).ConnectionRef = pRVar7;
      local_1d8._M_dataplus._M_p = (pointer)local_1b8._0_8_;
      if ((undefined1 *)local_1b8._0_8_ == local_1b8 + 0x10) {
        return (Result)(ErrorResult *)this;
      }
      goto LAB_001299b1;
    }
    data = *(uint8_t **)(in_RSI + 0x6290);
    if (data != (uint8_t *)0x0) {
      MessageDecompressor::InsertUncompressed(local_1e0,data,(iVar3 + uVar4) - (int)data);
      *(undefined8 *)(in_RSI + 0x6290) = 0;
    }
  } while( true );
}

Assistant:

Result SessionIncoming::resumeProcessing()
{
    // Run processing loop
    for (;;)
    {
        SiameseOriginalPacket packet;
        packet.PacketNum = FECNextExpectedPacketNum;

        // See if we already have the next one in sequence
        const int getResult = siamese_decoder_get(FECDecoder, &packet);

        if (getResult == Siamese_NeedMoreData) {
            break;
        }

        if (getResult != Siamese_Success)
        {
            const Result result = Result("SessionIncoming::resumeProcessing", "siamese_decoder_get failed", ErrorType::Siamese, getResult);
            Deps.Logger->Error("siamese_decoder_get failed: ", result.ToJson());
            TONK_DEBUG_BREAK();
            return result;
        }

        // Reset the compression state machine
        FirstReliable = nullptr;

        // Increment the next expected packet number
        FECNextExpectedPacketNum = SIAMESE_PACKET_NUM_INC(FECNextExpectedPacketNum);

        siamese::ReadByteStream frameReader(packet.Data, packet.DataBytes);

        // Process all messages contained in the datagram:
        while (frameReader.Remaining() >= protocol::kMessageFrameBytes)
        {
            // Read message frame header
            unsigned messageType = frameReader.Read16();
            const unsigned messageBytes = messageType & protocol::kMessageLengthMask;

            if (frameReader.Remaining() < messageBytes) {
                TONK_DEBUG_BREAK();
                return Result("SessionIncoming::resumeProcessing", "Truncated message", ErrorType::Tonk, Tonk_InvalidData);
            }

            messageType >>= protocol::kMessageLengthBits;
            const uint8_t* messageData = frameReader.Read(messageBytes);

            /*
                When processing data at this stage, unreliable and unordered data
                has already been delivered for sure, so we can skip it here.

                Unordered (reliable) data specifically might arrive five ways:

                (1) In sequence -> Delivered right away
                (2) Out of sequence original (not seen yet) -> Delivered right away
                (3) Out of sequence original (but seen already) -> Not delivered
                (4) Recovered by FEC (not seen yet) -> Delivered right away
                (5) After FEC recovery (already seen) -> Not delivered

                Cases (3) and (5) are what we are handling with this check.
            */
            if (messageType < protocol::MessageType_StartOfReliables ||
                messageType == protocol::MessageType_Unordered)
            {
                continue;
            }

            const Result result = handleReliableMessage(
                messageType,
                messageData,
                messageBytes);
            if (result.IsFail()) {
                return result;
            }
        }

        // If the message payload was not completely used:
        if (frameReader.Remaining() > 0)
        {
            TONK_DEBUG_BREAK(); // Invalid data
            return Result("SessionIncoming::resumeProcessing", "Invalid frame", ErrorType::Tonk, Tonk_InvalidData);
        }

        // Insert remaining uncompressed bytes
        insertUncompressed(frameReader.Peek());
    }

    return Result::Success();
}